

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_info.cc
# Opt level: O1

void __thiscall SystemInfo::SetOsBit(SystemInfo *this)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  string bit;
  utsname unameData;
  long *local_1d0 [2];
  long local_1c0 [2];
  utsname local_1ae;
  
  std::__cxx11::string::_M_replace
            ((ulong)&this->os_bit_,0,(char *)(this->os_bit_)._M_string_length,0x3130d1);
  uname(&local_1ae);
  local_1d0[0] = local_1c0;
  sVar2 = strlen(local_1ae.machine);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1d0,local_1ae.machine,local_1ae.machine + sVar2);
  iVar1 = std::__cxx11::string::compare((char *)local_1d0);
  if (iVar1 == 0) {
    pcVar3 = "64 bit";
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)local_1d0);
    if (iVar1 != 0) goto LAB_001e10a7;
    pcVar3 = "32 bit";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->os_bit_,0,(char *)(this->os_bit_)._M_string_length,(ulong)pcVar3);
LAB_001e10a7:
  if (local_1d0[0] != local_1c0) {
    operator_delete(local_1d0[0],local_1c0[0] + 1);
  }
  return;
}

Assistant:

void SystemInfo::SetOsBit()
{
    os_bit_ = "";

#if defined(YACCLAB_WINDOWS)
    // Compiler independent, works on Windows
    typedef BOOL(WINAPI *LPFN_ISWOW64PROCESS) (HANDLE, PBOOL);
    LPFN_ISWOW64PROCESS fnIsWow64Process;
    BOOL bIsWow64 = FALSE;

    //IsWow64Process is not available on all supported versions of Windows.
    //Use GetModuleHandle to get a handle to the DLL that contains the function
    //and GetProcAddress to get a pointer to the function if available.

    fnIsWow64Process = (LPFN_ISWOW64PROCESS)GetProcAddress(
        GetModuleHandle(TEXT("kernel32")), "IsWow64Process");

    if (NULL != fnIsWow64Process) {
        if (!fnIsWow64Process(GetCurrentProcess(), &bIsWow64)) {
            //handle error
            return;
        }
    }
    if (bIsWow64)
        os_bit_ = "64 bit";
    else
        os_bit_ = "32 bit";

#elif defined(YACCLAB_LINUX) || defined(YACCLAB_UNIX)
    struct utsname unameData;
    uname(&unameData);
    string bit = unameData.machine;
    if (bit == "x86_64")
        os_bit_ = "64 bit";
    else if (bit == "i686")
        os_bit_ = "32 bit";
#elif defined(YACCLAB_APPLE)
    // TODO
#endif
}